

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O1

void P_PlayerInSpecialSector(player_t *player,sector_t *sector)

{
  APlayerPawn *pAVar1;
  AInventory *pAVar2;
  AInventory *pAVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  bool bVar8;
  double dVar9;
  FName local_54;
  DAngle local_50;
  DVector3 local_48;
  
  if (sector == (sector_t *)0x0) {
    pAVar1 = player->mo;
    sector = (pAVar1->super_AActor).Sector;
    local_48.X = (pAVar1->super_AActor).__Pos.X;
    local_48.Y = (pAVar1->super_AActor).__Pos.Y;
    dVar9 = sector_t::LowestFloorAt(sector,(DVector2 *)&local_48,(sector_t_conflict **)0x0);
    if ((1.52587890625e-05 <= ABS((pAVar1->super_AActor).__Pos.Z - dVar9)) &&
       ((player->mo->super_AActor).waterlevel == 0)) {
      return;
    }
  }
  iVar5 = sector->damageamount;
  if (iVar5 < 1) {
    if ((iVar5 < 0) && (level.time % (int)sector->damageinterval == 0)) {
      P_GiveBody(&player->mo->super_AActor,-iVar5,100);
    }
  }
  else {
    pAVar2 = (player->mo->super_AActor).Inventory.field_0.p;
    pPVar4 = APowerIronFeet::RegistrationInfo.MyClass;
    if ((pAVar2 != (AInventory *)0x0) &&
       (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (player->mo->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      pAVar2 = (AInventory *)0x0;
      pPVar4 = APowerIronFeet::RegistrationInfo.MyClass;
    }
    while (pAVar3 = pAVar2, APowerIronFeet::RegistrationInfo.MyClass = pPVar4,
          pAVar3 != (AInventory *)0x0) {
      if ((pAVar3->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(pAVar3->super_AActor).super_DThinker.super_DObject._vptr_DObject)();
        (pAVar3->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar7 = (pAVar3->super_AActor).super_DThinker.super_DObject.Class;
      bVar8 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar4 && bVar8) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar8 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (bVar8) break;
      pAVar2 = (pAVar3->super_AActor).Inventory.field_0.p;
      pPVar4 = APowerIronFeet::RegistrationInfo.MyClass;
      if ((pAVar2 != (AInventory *)0x0) &&
         (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        (pAVar3->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
        pAVar2 = (AInventory *)0x0;
        pPVar4 = APowerIronFeet::RegistrationInfo.MyClass;
      }
    }
    if ((sector->Flags & 0x100) != 0) {
      *(byte *)&player->cheats = (byte)player->cheats & 0xfd;
    }
    if ((pAVar3 == (AInventory *)0x0) ||
       (uVar6 = FRandom::GenRand32(&pr_playerinspecialsector),
       (int)(uVar6 & 0xff) < (int)sector->leakydamage)) {
      if ((sector->Flags & 0x400) == 0) {
        if (level.time % (int)sector->damageinterval == 0) {
          if ((player->cheats & 0x2000002U) == 0) {
            local_54.Index = (sector->damagetype).super_FName.Index;
            local_50.Degrees = 0.0;
            P_DamageMobj(&player->mo->super_AActor,(AActor *)0x0,(AActor *)0x0,sector->damageamount,
                         &local_54,0,&local_50);
          }
          if ((((sector->Flags & 0x200) != 0) && (player->health < 0xb)) &&
             ((deathmatch.Value == 0 || ((dmflags.Value._1_1_ & 4) == 0)))) {
            G_ExitLevel(0,false);
          }
          if ((sector->Flags & 0x80) != 0) {
            pAVar1 = player->mo;
            local_48.X = (pAVar1->super_AActor).__Pos.X;
            local_48.Y = (pAVar1->super_AActor).__Pos.Y;
            local_48.Z = (pAVar1->super_AActor).__Pos.Z;
            P_HitWater(&pAVar1->super_AActor,(pAVar1->super_AActor).Sector,&local_48,false,true,true
                      );
          }
        }
      }
      else {
        player->hazardcount = player->hazardcount + sector->damageamount;
        (player->hazardtype).Index = (sector->damagetype).super_FName.Index;
        player->hazardinterval = (int)sector->damageinterval;
      }
    }
  }
  if ((int)sector->Flags < 0) {
    sector->Flags = sector->Flags & 0x7fffffff;
    P_GiveSecret(&player->mo->super_AActor,true,true,
                 (int)((ulong)((long)sector - (long)sectors) >> 3) * 0x7a44c6b);
  }
  return;
}

Assistant:

void P_PlayerInSpecialSector (player_t *player, sector_t * sector)
{
	if (sector == NULL)
	{
		// Falling, not all the way down yet?
		sector = player->mo->Sector;
		if (!player->mo->isAtZ(sector->LowestFloorAt(player->mo))
			&& !player->mo->waterlevel)
		{
			return;
		}
	}

	// Has hit ground.
	AInventory *ironfeet;

	// [RH] Apply any customizable damage
	if (sector->damageamount > 0)
	{
		// Allow subclasses. Better would be to implement it as armor and let that reduce
		// the damage as part of the normal damage procedure. Unfortunately, I don't have
		// different damage types yet, so that's not happening for now.
		for (ironfeet = player->mo->Inventory; ironfeet != NULL; ironfeet = ironfeet->Inventory)
		{
			if (ironfeet->IsKindOf (RUNTIME_CLASS(APowerIronFeet)))
				break;
		}

		if (sector->Flags & SECF_ENDGODMODE) player->cheats &= ~CF_GODMODE;
		if ((ironfeet == NULL || pr_playerinspecialsector() < sector->leakydamage))
		{
			if (sector->Flags & SECF_HAZARD)
			{
				player->hazardcount += sector->damageamount;
				player->hazardtype = sector->damagetype;
				player->hazardinterval = sector->damageinterval;
			}
			else if (level.time % sector->damageinterval == 0)
			{
				if (!(player->cheats & (CF_GODMODE|CF_GODMODE2))) P_DamageMobj(player->mo, NULL, NULL, sector->damageamount, sector->damagetype);
				if ((sector->Flags & SECF_ENDLEVEL) && player->health <= 10 && (!deathmatch || !(dmflags & DF_NO_EXIT)))
				{
					G_ExitLevel(0, false);
				}
				if (sector->Flags & SECF_DMGTERRAINFX)
				{
					P_HitWater(player->mo, player->mo->Sector, player->mo->Pos(), false, true, true);
				}
			}
		}
	}
	else if (sector->damageamount < 0)
	{
		if (level.time % sector->damageinterval == 0)
		{
			P_GiveBody(player->mo, -sector->damageamount, 100);
		}
	}

	if (sector->isSecret())
	{
		sector->ClearSecret();
		P_GiveSecret(player->mo, true, true, int(sector - sectors));
	}
}